

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall r_comp::Compiler::hlp_reference(Compiler *this,Ptr *node,uint16_t *index)

{
  pointer pbVar1;
  element_type *peVar2;
  size_t __n;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  long lVar6;
  
  iVar3 = std::__cxx11::string::compare
                    ((char *)&((node->
                               super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->label);
  if (iVar3 == 0) {
    pbVar1 = (this->hlp_references).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(this->hlp_references).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
    if (lVar6 != 0) {
      peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      __n = (peVar2->cmd)._M_string_length;
      uVar4 = 0;
      bVar5 = 0;
      do {
        if ((__n == pbVar1[uVar4]._M_string_length) &&
           ((__n == 0 ||
            (iVar3 = bcmp((peVar2->cmd)._M_dataplus._M_p,pbVar1[uVar4]._M_dataplus._M_p,__n),
            iVar3 == 0)))) {
          *index = (ushort)bVar5;
          return true;
        }
        bVar5 = bVar5 + 1;
        uVar4 = (ulong)bVar5;
      } while (uVar4 < (ulong)(lVar6 >> 5));
    }
  }
  return false;
}

Assistant:

bool Compiler::hlp_reference(RepliStruct::Ptr node, uint16_t &index)
{
    if (node->label != "") {
        return false;
    }

    for (uint8_t i = 0; i < hlp_references.size(); ++i) {
        if (node->cmd == hlp_references[i]) {
            index = i;
            return true;
        }
    }

    return false;
}